

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucol_res.cpp
# Opt level: O1

CollationCacheEntry * __thiscall
icu_63::CollationLoader::loadFromLocale(CollationLoader *this,UErrorCode *errorCode)

{
  Locale *this_00;
  UBool UVar1;
  char *pcVar2;
  UResourceBundle *pUVar3;
  Locale *other;
  CollationCacheEntry *pCVar4;
  Locale requestedLocale;
  Locale LStack_1d8;
  Locale local_f8;
  
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    this_00 = &this->locale;
    pcVar2 = Locale::getBaseName(this_00);
    pUVar3 = ures_openNoDefault_63("icudt63l-coll",pcVar2,errorCode);
    this->bundle = pUVar3;
    if (*errorCode == U_MISSING_RESOURCE_ERROR) {
      *errorCode = U_USING_DEFAULT_WARNING;
      SharedObject::addRef(&this->rootEntry->super_SharedObject);
      pCVar4 = this->rootEntry;
    }
    else {
      Locale::Locale(&local_f8,this_00);
      pcVar2 = ures_getLocaleByType_63(this->bundle,ULOC_ACTUAL_LOCALE,errorCode);
      if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
        Locale::Locale(&LStack_1d8,pcVar2,(char *)0x0,(char *)0x0,(char *)0x0);
        other = Locale::operator=(&this->validLocale,&LStack_1d8);
        Locale::operator=(this_00,other);
        Locale::~Locale(&LStack_1d8);
        if (this->type[0] != '\0') {
          Locale::setKeywordValue(this_00,"collation",this->type,errorCode);
        }
        UVar1 = Locale::operator==(this_00,&local_f8);
        if (UVar1 == '\0') {
          pCVar4 = getCacheEntry(this,errorCode);
        }
        else {
          pCVar4 = loadFromBundle(this,errorCode);
        }
      }
      else {
        pCVar4 = (CollationCacheEntry *)0x0;
      }
      Locale::~Locale(&local_f8);
    }
  }
  else {
    pCVar4 = (CollationCacheEntry *)0x0;
  }
  return pCVar4;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ucol_getFunctionalEquivalent(char* result, int32_t resultCapacity,
                             const char* keyword, const char* locale,
                             UBool* isAvailable, UErrorCode* status)
{
    // N.B.: Resource name is "collations" but keyword is "collation"
    return ures_getFunctionalEquivalent(result, resultCapacity, U_ICUDATA_COLL,
        "collations", keyword, locale,
        isAvailable, TRUE, status);
}